

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_4,_2>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_4,_2>_> *this,EvalContext *ctx)

{
  Environment *pEVar1;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar2;
  Expr<tcu::Matrix<float,_4,_2>_> *pEVar3;
  IVal *this_00;
  IVal local_1a8;
  IVal local_d8;
  EvalContext *local_18;
  EvalContext *ctx_local;
  VariableStatement<tcu::Matrix<float,_4,_2>_> *this_local;
  
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_>
             ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_>
                           *)&this->m_value);
    Expr<tcu::Matrix<float,_4,_2>_>::evaluate(&local_1a8,pEVar3,local_18);
    pEVar1 = local_18->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             ::operator*(&(this->m_variable).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                        );
    this_00 = Environment::lookup<tcu::Matrix<float,4,2>>(pEVar1,pVVar2);
    tcu::Matrix<tcu::Interval,_4,_2>::operator=(this_00,&local_1a8);
    tcu::Matrix<tcu::Interval,_4,_2>::~Matrix(&local_1a8);
  }
  else {
    pEVar1 = ctx->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             ::operator*(&(this->m_variable).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                        );
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_>
             ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_>
                           *)&this->m_value);
    Expr<tcu::Matrix<float,_4,_2>_>::evaluate(&local_d8,pEVar3,local_18);
    Environment::bind<tcu::Matrix<float,4,2>>(pEVar1,pVVar2,&local_d8);
    tcu::Matrix<tcu::Interval,_4,_2>::~Matrix(&local_d8);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}